

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::compress_block_internal(lzcompressor *this,void *pBuf,uint buf_len)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  lzdecision *plVar5;
  lzdecision *plVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  uchar *puVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  void *pvVar12;
  parse_thread_state *ppVar13;
  bool bVar14;
  char cVar15;
  bool bVar16;
  int iVar17;
  state *psVar18;
  undefined8 uVar19;
  int *piVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  void *pvVar24;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pData_ptr;
  void *extraout_RDX_01;
  sem_t *psVar25;
  uint uVar26;
  void *pvVar27;
  ulong uVar28;
  search_accelerator *psVar29;
  uint uVar30;
  uint uVar31;
  symbol_codec *codec;
  uint parse_thread_index;
  uint uVar32;
  uint uVar33;
  bool *pbVar34;
  long lVar35;
  bool bVar36;
  lzdecision lzdec;
  lzdecision lzdec_00;
  lzdecision lzdec_01;
  uint cur_dict_ofs;
  uint bytes_to_match;
  uint local_f4;
  void *local_f0;
  uint local_e4;
  state *local_e0;
  search_accelerator *local_d8;
  void *local_d0;
  uint local_c4;
  ulong local_c0;
  symbol_codec *local_b8;
  ulong local_b0;
  void *local_a8;
  ulong local_a0;
  uint local_94;
  uint *local_90;
  void *local_88;
  state *local_80;
  state *local_78;
  parse_thread_state *local_70;
  bool *local_68;
  parse_thread_state *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->m_src_size < 0) {
    return false;
  }
  uVar28 = (ulong)buf_len;
  this->m_src_size = this->m_src_size + uVar28;
  bVar14 = search_accelerator::add_bytes_begin(&this->m_accel,buf_len,(uint8 *)pBuf);
  if (bVar14) {
    local_e0 = &this->m_state;
    local_d8 = &this->m_accel;
    local_88 = pBuf;
    state::operator=(&this->m_start_of_block_state,local_e0);
    uVar26 = (this->m_accel).m_max_dict_size - 1 & (this->m_accel).m_lookahead_pos;
    this->m_block_start_dict_ofs = uVar26;
    codec = &this->m_codec;
    uVar31 = (uint)codec;
    local_f4 = uVar26;
    local_e4 = buf_len;
    cVar15 = lzham::symbol_codec::start_encoding(uVar31);
    if (((cVar15 != '\0') && (cVar15 = lzham::symbol_codec::encode_bits(uVar31,1), cVar15 != '\0'))
       && (cVar15 = lzham::symbol_codec::encode_arith_init(), cVar15 != '\0')) {
      local_80 = &this->m_start_of_block_state;
      state::start_of_block(local_e0,local_d8,uVar26,this->m_block_index);
      uVar32 = (this->m_params).m_lzham_compress_flags & 0x10;
      if (uVar32 != 0) {
        state::reset_update_rate(local_e0);
      }
      lzham::symbol_codec::encode_bits(uVar31,uVar32 >> 4);
      local_94 = this->m_step;
      uVar31 = buf_len;
      if (buf_len != 0) {
        local_70 = this->m_parse_thread_state + 8;
        local_78 = &this->m_parse_thread_state[8].super_raw_parse_thread_state.m_state;
        local_90 = (this->m_state).super_state_base.m_match_hist;
        local_60 = this->m_parse_thread_state;
        local_68 = &this->m_parse_thread_state[0].super_raw_parse_thread_state.m_use_semaphore;
        local_c0 = 0;
        local_b8 = codec;
        local_b0 = uVar28;
        local_a0 = (ulong)buf_len;
        do {
          if ((buf_len < 0x180) || ((this->m_params).m_pSeed_bytes == (void *)0x0)) {
LAB_00109944:
            uVar26 = (buf_len + 0xbff) / 0xc00;
            if (this->m_num_parse_threads < uVar26) {
              uVar26 = this->m_num_parse_threads;
            }
            uVar31 = (this->m_params).m_lzham_compress_flags;
            if (((((uVar31 & 4) == 0) && (this->m_use_task_pool == true)) &&
                ((this->m_accel).m_max_helper_threads != 0)) &&
               (uVar26 = uVar26 + (int)(this->m_accel).m_num_completed_helper_threads, 7 < uVar26))
            {
              uVar26 = 8;
            }
            if ((uVar31 & 0x40) != 0) {
              uVar26 = 1;
            }
            pvVar24 = (void *)(ulong)uVar26;
            if (buf_len < 0x600) {
              pvVar24 = (void *)0x1;
            }
            if ((this->m_block_index == 0) && (local_f4 - this->m_block_start_dict_ofs < 0x3000)) {
              local_c4 = buf_len;
              if (0xbff < buf_len) {
                local_c4 = 0xc00;
              }
LAB_001099ea:
              local_58._0_4_ = (local_e0->super_state_base).m_cur_ofs;
              local_58._4_4_ = (local_e0->super_state_base).m_cur_state;
              uStack_50 = 0;
              local_48 = *(undefined8 *)local_90;
              uStack_40 = *(undefined8 *)(local_90 + 2);
              bVar14 = true;
              pvVar24 = (void *)0x1;
LAB_00109a25:
              local_a8 = (void *)(ulong)((int)pvVar24 - 1);
              pvVar27 = (void *)0x0;
              pbVar34 = local_68;
              uVar26 = local_f4;
              uVar31 = local_c4;
              local_f0 = pvVar24;
              local_d0 = pvVar24;
              do {
                if (bVar14) {
                  *(state **)(pbVar34 + -0x15621f) = local_e0;
                  psVar18 = local_e0;
                }
                else {
                  *(state **)(pbVar34 + -0x15621f) = (state *)(pbVar34 + -0x156757);
                  state::operator=((state *)(pbVar34 + -0x156757),local_e0);
                  psVar18 = *(state **)(pbVar34 + -0x15621f);
                  pvVar24 = extraout_RDX;
                }
                (psVar18->super_state_base).m_cur_ofs = uVar26;
                if (pvVar27 != (void *)0x0) {
                  state::reset_state_partial(*(state **)(pbVar34 + -0x15621f));
                  pvVar24 = extraout_RDX_00;
                }
                pvVar12 = local_d0;
                psVar29 = local_d8;
                pbVar34[-2] = pvVar27 != (void *)0x0;
                ((raw_parse_thread_state *)(pbVar34 + -0x15675f))->m_start_ofs = uVar26;
                uVar32 = uVar31;
                if (local_a8 != pvVar27) {
                  uVar32 = (uint)((ulong)local_c4 / ((ulong)local_f0 & 0xffffffff));
                  pvVar24 = (void *)((ulong)local_c4 % ((ulong)local_f0 & 0xffffffff));
                }
                if (0xbff < uVar32) {
                  uVar32 = 0xc00;
                }
                *(uint *)(pbVar34 + -0x15675b) = uVar32;
                *(uint *)(pbVar34 + -0x17) = (this->m_params).m_extreme_parsing_max_best_arrivals;
                *(uint *)(pbVar34 + -0x13) = 0xffffffff;
                pbVar34[-3] = false;
                *(undefined8 *)(pbVar34 + -0xb) = 0xffffffff;
                bVar16 = this->m_use_task_pool;
                *pbVar34 = (bool)((pvVar27 != (void *)0x0 && (uint)local_f0 != 1) & bVar16);
                bVar36 = (this->m_params).m_compression_level != cCompressionLevelUber;
                pvVar24 = (void *)CONCAT71((int7)((ulong)pvVar24 >> 8),bVar36);
                if (bVar14 && !bVar36) {
                  pvVar24 = (void *)0x40;
                  if (((this->m_params).m_lzham_compress_flags & 2) != 0) {
                    pvVar24 = (void *)0x10;
                  }
                  *(uint *)(pbVar34 + -0xb) = (uint)pvVar24;
                }
                uVar26 = uVar26 + uVar32;
                uVar31 = uVar31 - uVar32;
                pvVar27 = (void *)((long)pvVar27 + 1);
                pbVar34 = pbVar34 + 0x156800;
              } while (local_d0 != pvVar27);
              if ((1 < (uint)local_f0 & bVar16) == 0) {
                pvVar27 = (void *)0x0;
                do {
                  parse_job_callback(this,(uint64)pvVar27,pvVar24);
                  pvVar27 = (void *)((long)pvVar27 + 1);
                  pvVar24 = extraout_RDX_01;
                  codec = local_b8;
                  uVar28 = local_b0;
                } while (pvVar12 != pvVar27);
              }
              else {
                bVar16 = task_pool::
                         queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
                                   ((this->m_params).m_pTask_pool,this,
                                    (offset_in_lzcompressor_to_subr)parse_job_callback,0,1,local_a8)
                ;
                psVar29 = local_d8;
                if (!bVar16) {
                  return false;
                }
                parse_job_callback(this,0,pData_ptr);
                codec = local_b8;
                uVar28 = local_b0;
              }
              pvVar24 = local_f0;
              if (bVar14) {
                (local_e0->super_state_base).m_cur_ofs = (int)local_58;
                (local_e0->super_state_base).m_cur_state = (int)((ulong)local_58 >> 0x20);
                *(undefined8 *)local_90 = local_48;
                *(undefined8 *)(local_90 + 2) = uStack_40;
              }
              bVar14 = false;
              local_b8 = codec;
              local_b0 = uVar28;
            }
            else {
              iVar17 = (int)pvVar24;
              local_c4 = iVar17 * 0xc00;
              if (buf_len < (uint)(iVar17 * 0xc00)) {
                local_c4 = buf_len;
              }
              if (iVar17 != 0) {
                if (iVar17 == 1) goto LAB_001099ea;
                bVar14 = false;
                goto LAB_00109a25;
              }
              bVar14 = true;
              psVar29 = local_d8;
            }
            local_f0 = pvVar24;
            if ((local_c0 & 1) == 0) {
              uVar19 = lzham::adler32(local_88,uVar28,this->m_src_adler32);
              this->m_src_adler32 = (uint32)uVar19;
              local_c0 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
            }
            uVar33 = 0;
            uVar31 = (uint)local_a0;
            if (!bVar14) {
              local_d0 = (void *)((ulong)local_f0 & 0xffffffff);
              pvVar24 = (void *)0x0;
              uVar33 = 0;
              uVar23 = local_a0;
              do {
                ppVar13 = local_60;
                iVar17 = (int)local_f0;
                local_a8 = pvVar24;
                if (local_60[(long)pvVar24].super_raw_parse_thread_state.m_use_semaphore == true) {
                  iVar17 = sem_wait((sem_t *)&local_60[(long)pvVar24].super_raw_parse_thread_state.
                                              m_finished);
                  if ((iVar17 != 0) && (piVar20 = __errno_location(), *piVar20 != 0x6e)) {
                    lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                               ,0xb6);
                  }
                  ppVar13[(long)pvVar24].super_raw_parse_thread_state.m_use_semaphore = false;
                  iVar17 = (int)local_f0;
                }
                if (ppVar13[(long)pvVar24].super_raw_parse_thread_state.m_failed == true) {
                  if (iVar17 == 1) {
                    return false;
                  }
                  psVar25 = (sem_t *)&this->m_parse_thread_state[1].super_raw_parse_thread_state.
                                      m_finished;
                  lVar35 = (long)local_d0 - 1;
                  do {
                    if (*(char *)((long)psVar25 + -1) == '\x01') {
                      iVar17 = sem_wait(psVar25);
                      if ((iVar17 != 0) && (piVar20 = __errno_location(), *piVar20 != 0x6e)) {
                        lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                                   ,0xb6);
                      }
                      *(undefined1 *)((long)psVar25 + -1) = 0;
                    }
                    psVar25 = psVar25 + 0xab40;
                    lVar35 = lVar35 + -1;
                  } while (lVar35 != 0);
                  return false;
                }
                if (ppVar13[(long)pvVar24].super_raw_parse_thread_state.m_issue_reset_state_partial
                    == true) {
                  bVar14 = state::encode_reset_state_partial(local_e0,codec,psVar29,local_f4);
                  if (!bVar14) {
                    if ((int)local_f0 == 1) {
                      return false;
                    }
                    psVar25 = (sem_t *)&this->m_parse_thread_state[1].super_raw_parse_thread_state.
                                        m_finished;
                    lVar35 = (long)local_d0 - 1;
                    do {
                      if (*(char *)((long)psVar25 + -1) == '\x01') {
                        iVar17 = sem_wait(psVar25);
                        if ((iVar17 != 0) && (piVar20 = __errno_location(), *piVar20 != 0x6e)) {
                          lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                                     ,0xb6);
                        }
                        *(undefined1 *)((long)psVar25 + -1) = 0;
                      }
                      psVar25 = psVar25 + 0xab40;
                      lVar35 = lVar35 + -1;
                    } while (lVar35 != 0);
                    return false;
                  }
                  this->m_step = this->m_step + 1;
                }
                uVar2 = ppVar13[(long)pvVar24].super_raw_parse_thread_state.m_best_decisions.m_size;
                if (uVar2 != 0) {
                  uVar26 = uVar2 - 1;
                  bVar14 = ppVar13[(long)pvVar24].super_raw_parse_thread_state.
                           m_emit_decisions_backwards;
                  uVar28 = (ulong)uVar26;
                  if (bVar14 == false) {
                    uVar28 = (ulong)bVar14;
                  }
                  if (bVar14 != false) {
                    uVar26 = 0;
                  }
                  plVar6 = ppVar13[(long)pvVar24].super_raw_parse_thread_state.m_best_decisions.m_p;
                  plVar5 = plVar6 + uVar28;
                  uVar3 = plVar5->m_pos;
                  uVar8 = plVar5->m_len;
                  lzdec_00.m_len = uVar8;
                  lzdec_00.m_pos = uVar3;
                  lzdec_00.m_dist = plVar6[uVar28].m_dist;
                  bVar16 = code_decision(this,lzdec_00,&local_f4,&local_e4);
                  if (!bVar16) {
LAB_00109e0d:
                    if ((int)local_f0 == 1) {
                      return false;
                    }
                    psVar25 = (sem_t *)&this->m_parse_thread_state[1].super_raw_parse_thread_state.
                                        m_finished;
                    lVar35 = (long)local_d0 - 1;
                    do {
                      if (*(char *)((long)psVar25 + -1) == '\x01') {
                        iVar17 = sem_wait(psVar25);
                        if ((iVar17 != 0) && (piVar20 = __errno_location(), *piVar20 != 0x6e)) {
                          lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                                     ,0xb6);
                        }
                        *(undefined1 *)((long)psVar25 + -1) = 0;
                      }
                      psVar25 = psVar25 + 0xab40;
                      lVar35 = lVar35 + -1;
                    } while (lVar35 != 0);
                    return false;
                  }
                  while( true ) {
                    plVar5 = ppVar13[(long)pvVar24].super_raw_parse_thread_state.m_best_decisions.
                             m_p;
                    uVar33 = uVar33 + plVar5[uVar28].m_len + (uint)(plVar5[uVar28].m_len == 0);
                    psVar29 = local_d8;
                    uVar23 = local_a0;
                    if (uVar26 == (uint)uVar28) break;
                    uVar28 = (ulong)((uint)uVar28 + (-(uint)bVar14 | 1));
                    uVar4 = plVar5[uVar28].m_pos;
                    uVar9 = plVar5[uVar28].m_len;
                    lzdec_01.m_len = uVar9;
                    lzdec_01.m_pos = uVar4;
                    lzdec_01.m_dist = plVar5[uVar28].m_dist;
                    bVar16 = code_decision(this,lzdec_01,&local_f4,&local_e4);
                    if (!bVar16) goto LAB_00109e0d;
                  }
                }
                uVar31 = (uint)uVar23;
                pvVar24 = (void *)((long)local_a8 + 1);
                uVar28 = local_b0;
                codec = local_b8;
              } while (pvVar24 != local_d0);
            }
            search_accelerator::advance_bytes(psVar29,uVar33);
          }
          else {
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_pState = local_78;
            state::operator=(local_78,local_e0);
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_state.super_state_base.
            m_cur_ofs = local_f4;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_start_ofs = local_f4;
            uVar26 = 0x10000;
            if (buf_len < 0x10000) {
              uVar26 = buf_len;
            }
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_bytes_to_match = uVar26;
            uVar26 = buf_len / 0x180;
            if (buf_len < 0x300) {
              uVar26 = 2;
            }
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_max_greedy_decisions =
                 uVar26;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up =
                 false;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_issue_reset_state_partial =
                 false;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.
            m_greedy_parse_total_bytes_coded = 0;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_parse_early_out_thresh =
                 0xffffffff;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_bytes_actually_parsed = 0;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_use_semaphore = false;
            bVar16 = greedy_parse(this,local_70);
            psVar29 = local_d8;
            bVar14 = this->m_parse_thread_state[8].super_raw_parse_thread_state.
                     m_greedy_parse_gave_up;
            if (!bVar16) {
              if ((bVar14 & 1U) == 0) {
                return false;
              }
LAB_0010985a:
              uVar23 = (ulong)this->m_parse_thread_state[8].super_raw_parse_thread_state.
                              m_best_decisions.m_size;
              if (uVar23 != 0) {
                piVar20 = &(this->m_parse_thread_state[8].super_raw_parse_thread_state.
                            m_best_decisions.m_p)->m_len;
                uVar21 = 0;
                uVar32 = 0;
                uVar31 = 0;
                uVar26 = 0;
                do {
                  uVar1 = *piVar20;
                  uVar30 = uVar1 + (uVar1 == 0);
                  if ((uVar1 < 0x102) && (uVar32 = uVar32 + 1, uVar22 = uVar21, 0x10 < uVar32))
                  break;
                  uVar31 = uVar31 + uVar30;
                  if (uVar26 <= uVar30) {
                    uVar26 = uVar30;
                  }
                  uVar21 = uVar21 + 1;
                  piVar20 = piVar20 + 3;
                  uVar22 = uVar23;
                } while (uVar23 != uVar21);
                uVar32 = (uint)uVar22;
                if ((0x101 < uVar26) && (0x17f < (uint)((ulong)uVar31 / (uVar22 & 0xffffffff))))
                goto LAB_001098cc;
              }
              goto LAB_00109944;
            }
            if ((bVar14 & 1U) != 0) goto LAB_0010985a;
            uVar32 = this->m_parse_thread_state[8].super_raw_parse_thread_state.m_best_decisions.
                     m_size;
LAB_001098cc:
            if (uVar32 == 0) goto LAB_00109944;
            lVar35 = 0;
            do {
              plVar5 = this->m_parse_thread_state[8].super_raw_parse_thread_state.m_best_decisions.
                       m_p;
              lzdec.m_dist = *(int *)((long)&plVar5->m_dist + lVar35);
              lzdec._0_8_ = *(undefined8 *)((long)&plVar5->m_pos + lVar35);
              bVar14 = code_decision(this,lzdec,&local_f4,&local_e4);
              if (!bVar14) {
                return false;
              }
              iVar17 = *(int *)((long)&(this->m_parse_thread_state[8].super_raw_parse_thread_state.
                                        m_best_decisions.m_p)->m_len + lVar35);
              search_accelerator::advance_bytes(psVar29,iVar17 + (uint)(iVar17 == 0));
              lVar35 = lVar35 + 0xc;
            } while ((ulong)uVar32 * 0xc != lVar35);
            buf_len = local_e4;
            if ((this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up &
                local_e4 != 0) != 0) goto LAB_00109944;
            uVar31 = (uint)local_a0;
            if ((local_c0 & 1) == 0) {
              uVar19 = lzham::adler32(local_88,uVar28,this->m_src_adler32);
              this->m_src_adler32 = (uint32)uVar19;
              local_c0 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
            }
          }
          uVar26 = local_f4;
          buf_len = local_e4;
        } while (local_e4 != 0);
      }
      psVar29 = local_d8;
      search_accelerator::add_bytes_end(local_d8);
      bVar14 = state::encode_eob(local_e0,codec,psVar29,uVar26);
      if (bVar14) {
        cVar15 = lzham::symbol_codec::stop_encoding(SUB81(codec,0));
        if (cVar15 != '\0') {
          if (uVar31 <= *(uint *)&this->field_0x4d0) {
            state::operator=(local_e0,local_80);
            this->m_step = local_94;
            lzham::symbol_codec::reset();
            uVar26 = (uint)codec;
            cVar15 = lzham::symbol_codec::start_encoding(uVar26);
            if (cVar15 == '\0') {
              return false;
            }
            cVar15 = lzham::symbol_codec::encode_bits(uVar26,2);
            if (cVar15 == '\0') {
              return false;
            }
            uVar32 = uVar31 - 1;
            cVar15 = lzham::symbol_codec::encode_bits(uVar26,uVar32);
            if (cVar15 == '\0') {
              return false;
            }
            cVar15 = lzham::symbol_codec::encode_bits
                               (uVar26,(uVar32 >> 0x10 ^ uVar32 >> 8 ^ uVar32) & 0xff);
            if (cVar15 == '\0') {
              return false;
            }
            cVar15 = lzham::symbol_codec::encode_align_to_byte();
            if (cVar15 == '\0') {
              return false;
            }
            if (uVar31 != 0) {
              uVar31 = this->m_block_start_dict_ofs;
              puVar7 = (this->m_accel).m_dict.m_p;
              lVar35 = 0;
              do {
                cVar15 = lzham::symbol_codec::encode_bits
                                   (uVar26,(uint)puVar7[lVar35 + (ulong)uVar31]);
                if (cVar15 == '\0') {
                  return false;
                }
                lVar35 = lVar35 + 1;
              } while ((int)uVar28 != (int)lVar35);
            }
            cVar15 = lzham::symbol_codec::stop_encoding(SUB81(codec,0));
            if (cVar15 == '\0') {
              return false;
            }
          }
          if ((this->m_comp_buf).m_size == 0) {
            puVar7 = (this->m_comp_buf).m_p;
            uVar10 = *(undefined4 *)&this->field_0x4d0;
            uVar11 = *(undefined4 *)&this->field_0x4d4;
            uVar33 = (this->m_comp_buf).m_capacity;
            (this->m_comp_buf).m_p = *(uchar **)&this->field_0x4c8;
            (this->m_comp_buf).m_size = uVar10;
            (this->m_comp_buf).m_capacity = uVar11;
            *(uchar **)&this->field_0x4c8 = puVar7;
            *(undefined4 *)&this->field_0x4d0 = 0;
            *(uint *)&this->field_0x4d4 = uVar33;
          }
          else {
            bVar14 = vector<unsigned_char>::append
                               (&this->m_comp_buf,(vector<unsigned_char> *)&this->field_0x4c8);
            if (!bVar14) {
              return false;
            }
          }
          this->m_block_index = this->m_block_index + 1;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool lzcompressor::compress_block_internal(const void* pBuf, uint buf_len)
   {
      scoped_perf_section compress_block_timer(cVarArgs, "****** compress_block %u", m_block_index);

      LZHAM_ASSERT(pBuf);
      LZHAM_ASSERT(buf_len <= m_params.m_block_size);

      LZHAM_ASSERT(m_src_size >= 0);
      if (m_src_size < 0)
         return false;

      m_src_size += buf_len;

      // Important: Don't do any expensive work until after add_bytes_begin() is called, to increase parallelism.
      if (!m_accel.add_bytes_begin(buf_len, static_cast<const uint8*>(pBuf)))
      {
         LZHAM_LOG_ERROR(7047);
         return false;
      }

      bool computed_adler32 = false;

      m_start_of_block_state = m_state;

      m_block_start_dict_ofs = m_accel.get_lookahead_pos() & (m_accel.get_max_dict_size() - 1);

      uint cur_dict_ofs = m_block_start_dict_ofs;

      uint bytes_to_match = buf_len;

      if (!m_codec.start_encoding((buf_len * 9) / 8))
      {
         LZHAM_LOG_ERROR(7048);
         return false;
      }

      if (!m_block_index)
      {
         if (!send_configuration())
         {
            LZHAM_LOG_ERROR(7049);
            return false;
         }
      }

#ifdef LZHAM_LZDEBUG
      m_codec.encode_bits(166, 12);
#endif

      if (!m_codec.encode_bits(cCompBlock, cBlockHeaderBits))
      {
         LZHAM_LOG_ERROR(7050);
         return false;
      }

      if (!m_codec.encode_arith_init())
      {
         LZHAM_LOG_ERROR(7051);
         return false;
      }

      m_state.start_of_block(m_accel, cur_dict_ofs, m_block_index);

      bool emit_reset_update_rate_command = false;

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO)
      {
         emit_reset_update_rate_command = true;

         m_state.reset_update_rate();
      }

      // TODO: We could also issue a full huff/arith table reset (code 2), and see if that actually improves the block's compression.
      m_codec.encode_bits(emit_reset_update_rate_command ? 1 : 0, cBlockFlushTypeBits);

      //coding_stats initial_stats(m_stats);

      uint initial_step = m_step;

      while (bytes_to_match)
      {
         const uint cAvgAcceptableGreedyMatchLen = 384;
         if ((m_params.m_pSeed_bytes) && (bytes_to_match >= cAvgAcceptableGreedyMatchLen))
         {
            parse_thread_state &greedy_parse_state = m_parse_thread_state[cMaxParseThreads];

            greedy_parse_state.m_pState = &greedy_parse_state.m_state;
            greedy_parse_state.m_state = m_state;
            greedy_parse_state.m_state.m_cur_ofs = cur_dict_ofs;

            greedy_parse_state.m_issue_reset_state_partial = false;
            greedy_parse_state.m_start_ofs = cur_dict_ofs;
            greedy_parse_state.m_bytes_to_match = LZHAM_MIN(bytes_to_match, static_cast<uint>(CLZBase::cMaxHugeMatchLen));

            greedy_parse_state.m_max_greedy_decisions = LZHAM_MAX((bytes_to_match / cAvgAcceptableGreedyMatchLen), 2);
            greedy_parse_state.m_greedy_parse_gave_up = false;
            greedy_parse_state.m_greedy_parse_total_bytes_coded = 0;

            greedy_parse_state.m_parse_early_out_thresh = UINT_MAX;
            greedy_parse_state.m_bytes_actually_parsed = 0;

            greedy_parse_state.m_use_semaphore = false;

            if (!greedy_parse(greedy_parse_state))
            {
               if (!greedy_parse_state.m_greedy_parse_gave_up)
               {
                  LZHAM_LOG_ERROR(7052);
                  return false;
               }
            }

            uint num_greedy_decisions_to_code = 0;

            const lzham::vector<lzdecision> &best_decisions = greedy_parse_state.m_best_decisions;

            if (!greedy_parse_state.m_greedy_parse_gave_up)
               num_greedy_decisions_to_code = best_decisions.size();
            else
            {
               uint num_small_decisions = 0;
               uint total_match_len = 0;
               uint max_match_len = 0;

               uint i;
               for (i = 0; i < best_decisions.size(); i++)
               {
                  const lzdecision &dec = best_decisions[i];
                  if (dec.get_len() <= CLZBase::cMaxMatchLen)
                  {
                     num_small_decisions++;
                     if (num_small_decisions > 16)
                        break;
                  }

                  total_match_len += dec.get_len();
                  max_match_len = LZHAM_MAX(max_match_len, dec.get_len());
               }

               if (max_match_len > CLZBase::cMaxMatchLen)
               {
                  if ((total_match_len / i) >= cAvgAcceptableGreedyMatchLen)
                  {
                     num_greedy_decisions_to_code = i;
                  }
               }
            }

            if (num_greedy_decisions_to_code)
            {
               for (uint i = 0; i < num_greedy_decisions_to_code; i++)
               {
                  LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                  //LZHAM_ASSERT(i >= 0);
                  LZHAM_ASSERT(i < best_decisions.size());

#if LZHAM_UPDATE_STATS
                  bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                  m_stats.update(best_decisions[i], m_state, m_accel, cost);
#endif

                  if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                  {
                     LZHAM_LOG_ERROR(7053);
                     return false;
                  }

                  m_accel.advance_bytes(best_decisions[i].get_len());
               }

               if ((!greedy_parse_state.m_greedy_parse_gave_up) || (!bytes_to_match))
			   {
				   if (!computed_adler32)
				   {
					   computed_adler32 = true;

					   scoped_perf_section add_bytes_timer("adler32");
					   m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
				   }

                  continue;
			   }
            }
         }

         uint num_parse_jobs = LZHAM_MIN(m_num_parse_threads, (bytes_to_match + cMaxParseGraphNodes - 1) / cMaxParseGraphNodes);
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING) == 0)
         {
            if (m_use_task_pool && m_accel.get_max_helper_threads())
            {
               // Increase the number of active parse jobs as the match finder finishes up to keep CPU utilization up.
               num_parse_jobs += m_accel.get_num_completed_helper_threads();
               num_parse_jobs = LZHAM_MIN(num_parse_jobs, cMaxParseThreads);
            }
         }

         // Don't bother threading if the remaining bytes to parse is too small.
         if ((bytes_to_match < 1536) || (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING))
            num_parse_jobs = 1;

         // Update the coding statistics more frequently near the beginning of streams.
         if ((!m_block_index) && ((cur_dict_ofs - m_block_start_dict_ofs) < cMaxParseGraphNodes * 4))
            num_parse_jobs = 1;

         uint parse_thread_start_ofs = cur_dict_ofs;
         uint parse_thread_total_size = LZHAM_MIN(bytes_to_match, cMaxParseGraphNodes * num_parse_jobs);

         uint parse_thread_remaining = parse_thread_total_size;

         state_base saved_state;
         if (num_parse_jobs == 1)
            m_state.save_partial_state(saved_state);

         for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
         {
            parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

            if (num_parse_jobs == 1)
            {
               parse_thread.m_pState = &m_state;
            }
            else
            {
               parse_thread.m_pState = &parse_thread.m_state;
               parse_thread.m_state = m_state;
            }

            parse_thread.m_pState->m_cur_ofs = parse_thread_start_ofs;

            if (parse_thread_index > 0)
            {
               parse_thread.m_pState->reset_state_partial();
               parse_thread.m_issue_reset_state_partial = true;
            }
            else
            {
               parse_thread.m_issue_reset_state_partial = false;
            }

            parse_thread.m_start_ofs = parse_thread_start_ofs;
            if (parse_thread_index == (num_parse_jobs - 1))
               parse_thread.m_bytes_to_match = parse_thread_remaining;
            else
               parse_thread.m_bytes_to_match = parse_thread_total_size / num_parse_jobs;

            parse_thread.m_bytes_to_match = LZHAM_MIN(parse_thread.m_bytes_to_match, cMaxParseGraphNodes);
            LZHAM_ASSERT(parse_thread.m_bytes_to_match > 0);

            parse_thread.m_max_parse_node_states = m_params.m_extreme_parsing_max_best_arrivals;
            parse_thread.m_max_greedy_decisions = UINT_MAX;
            parse_thread.m_greedy_parse_gave_up = false;

            parse_thread.m_parse_early_out_thresh = UINT_MAX;
            parse_thread.m_bytes_actually_parsed = 0;

            parse_thread.m_use_semaphore = ((m_use_task_pool) && (num_parse_jobs > 1)) && (parse_thread_index > 0);

            if ((m_params.m_compression_level == cCompressionLevelUber) && (num_parse_jobs == 1))
            {
               // Allow the parsers to exit early if they encounter a graph bottleneck, so we can move the coding statistics forward before parsing again.
               parse_thread.m_parse_early_out_thresh = (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) ? 16 : 64;
            }

            parse_thread_start_ofs += parse_thread.m_bytes_to_match;
            parse_thread_remaining -= parse_thread.m_bytes_to_match;
         }

         {
            scoped_perf_section parse_timer("parsing");

            if ((m_use_task_pool) && (num_parse_jobs > 1))
            {
               {
                  scoped_perf_section queue_task_timer("queuing parse tasks");

                  if (!m_params.m_pTask_pool->queue_multiple_object_tasks(this, &lzcompressor::parse_job_callback, 1, num_parse_jobs - 1))
                     return false;
               }

               parse_job_callback(0, NULL);
            }
            else
            {
               for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
               {
                  parse_job_callback(parse_thread_index, NULL);
               }
            }
         }

         if (num_parse_jobs == 1)
            m_state.restore_partial_state(saved_state);

         if (!computed_adler32)
         {
            computed_adler32 = true;

            scoped_perf_section add_bytes_timer("adler32");
            m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
         }

#define LZHAM_RELEASE_SEMAPHORES for (uint pti = 1; pti < num_parse_jobs; pti++) if (m_parse_thread_state[pti].m_use_semaphore) { m_parse_thread_state[pti].m_finished.wait(); m_parse_thread_state[pti].m_use_semaphore = false; }

         {
            scoped_perf_section coding_timer("coding");

            uint total_bytes_parsed = 0;

            for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
            {
               parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

               if (parse_thread.m_use_semaphore)
               {
                  scoped_perf_section sect(cVarArgs, "Waiting for parser %u", parse_thread_index);
                  m_parse_thread_state[parse_thread_index].m_finished.wait();
                  m_parse_thread_state[parse_thread_index].m_use_semaphore = false;
               }

               if (parse_thread.m_failed)
               {
                  LZHAM_RELEASE_SEMAPHORES
                  LZHAM_LOG_ERROR(7054);
                  return false;
               }

               const lzham::vector<lzdecision> &best_decisions = parse_thread.m_best_decisions;

               if (parse_thread.m_issue_reset_state_partial)
               {
                  if (!m_state.encode_reset_state_partial(m_codec, m_accel, cur_dict_ofs))
                  {
                     LZHAM_RELEASE_SEMAPHORES
                     LZHAM_LOG_ERROR(7055);
                     return false;
                  }
                  m_step++;
               }

               if (best_decisions.size())
               {
                  int i = 0;
                  int end_dec_index = static_cast<int>(best_decisions.size()) - 1;
                  int dec_step = 1;
                  if (parse_thread.m_emit_decisions_backwards)
                  {
                     i = static_cast<int>(best_decisions.size()) - 1;
                     end_dec_index = 0;
                     dec_step = -1;
                     LZHAM_ASSERT(best_decisions.back().m_pos == (int)parse_thread.m_start_ofs);
                  }
                  else
                  {
                     LZHAM_ASSERT(best_decisions.front().m_pos == (int)parse_thread.m_start_ofs);
                  }

                  // Loop rearranged to avoid bad x64 codegen problem with MSVC2008.
                  for ( ; ; )
                  {
                     LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                     LZHAM_ASSERT(i >= 0);
                     LZHAM_ASSERT(i < (int)best_decisions.size());

#if LZHAM_UPDATE_STATS
                     bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                     m_stats.update(best_decisions[i], m_state, m_accel, cost);
                     //m_state.print(m_codec, *this, m_accel, best_decisions[i]);
#endif

                     if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                     {
                        LZHAM_RELEASE_SEMAPHORES
                        LZHAM_LOG_ERROR(7056);
                        return false;
                     }

                     total_bytes_parsed += best_decisions[i].get_len();

                     if (i == end_dec_index)
                        break;
                     i += dec_step;
                  }

                  LZHAM_NOTE_UNUSED(i);
               }

               LZHAM_ASSERT(cur_dict_ofs == parse_thread.m_start_ofs + parse_thread.m_bytes_actually_parsed);

            } // parse_thread_index

            m_accel.advance_bytes(total_bytes_parsed);

         } // coding

      } // while (bytes_to_match)

      {
         scoped_perf_section add_bytes_timer("add_bytes_end");
         m_accel.add_bytes_end();
      }

      if (!m_state.encode_eob(m_codec, m_accel, cur_dict_ofs))
      {
         LZHAM_LOG_ERROR(7057);
         return false;
      }

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(366, 12))
      {
         LZHAM_LOG_ERROR(7058);
         return false;
      }
#endif

      {
         scoped_perf_section stop_encoding_timer("stop_encoding");
         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7059);
            return false;
         }
      }

      // Coded the entire block - now see if it makes more sense to just send a raw/uncompressed block.

      uint compressed_size = m_codec.get_encoding_buf().size();
      LZHAM_NOTE_UNUSED(compressed_size);

      //bool used_raw_block = false;

#if !LZHAM_FORCE_ALL_RAW_BLOCKS
   #if (defined(LZHAM_DISABLE_RAW_BLOCKS) || defined(LZHAM_LZDEBUG))
       if (0)
   #else
       // TODO: Allow the user to control this threshold, i.e. if less than 1% then just store uncompressed.
       if (compressed_size >= buf_len)
   #endif
#endif
      {
         // Failed to compress the block, so go back to our original state and just code a raw block.
         m_state = m_start_of_block_state;
         m_step = initial_step;
         //m_stats = initial_stats;

         m_codec.reset();

         if (!m_codec.start_encoding(buf_len + 16))
         {
            LZHAM_LOG_ERROR(7060);
            return false;
         }

         if (!m_block_index)
         {
            if (!send_configuration())
            {
               LZHAM_LOG_ERROR(7061);
               return false;
            }
         }

#ifdef LZHAM_LZDEBUG
         if (!m_codec.encode_bits(166, 12))
         {
            LZHAM_LOG_ERROR(7062);
            return false;
         }
#endif

         if (!m_codec.encode_bits(cRawBlock, cBlockHeaderBits))
         {
            LZHAM_LOG_ERROR(7063);
            return false;
         }

         LZHAM_ASSERT(buf_len <= 0x1000000);
         if (!m_codec.encode_bits(buf_len - 1, 24))
         {
            LZHAM_LOG_ERROR(7064);
            return false;
         }

         // Write buf len check bits, to help increase the probability of detecting corrupted data more early.
         uint buf_len0 = (buf_len - 1) & 0xFF;
         uint buf_len1 = ((buf_len - 1) >> 8) & 0xFF;
         uint buf_len2 = ((buf_len - 1) >> 16) & 0xFF;
         if (!m_codec.encode_bits((buf_len0 ^ buf_len1) ^ buf_len2, 8))
         {
            LZHAM_LOG_ERROR(7065);
            return false;
         }

         if (!m_codec.encode_align_to_byte())
         {
            LZHAM_LOG_ERROR(7066);
            return false;
         }

         const uint8* pSrc = m_accel.get_ptr(m_block_start_dict_ofs);

         for (uint i = 0; i < buf_len; i++)
         {
            if (!m_codec.encode_bits(*pSrc++, 8))
            {
               LZHAM_LOG_ERROR(7067);
               return false;
            }
         }

         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7068);
            return false;
         }

         //used_raw_block = true;
         emit_reset_update_rate_command = false;
      }

      {
         scoped_perf_section append_timer("append");

         if (m_comp_buf.empty())
         {
            m_comp_buf.swap(m_codec.get_encoding_buf());
         }
         else
         {
            if (!m_comp_buf.append(m_codec.get_encoding_buf()))
            {
               LZHAM_LOG_ERROR(7069);
               return false;
            }
         }
      }

#if LZHAM_UPDATE_STATS
      LZHAM_VERIFY(m_stats.m_total_bytes == m_src_size);
      if (emit_reset_update_rate_command)
         m_stats.m_total_update_rate_resets++;
#endif

      m_block_index++;

      return true;
   }